

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
util::exception::exception<char_const(&)[22],int&,char_const(&)[6],CylHead&>
          (exception *this,char (*args) [22],int *args_1,char (*args_2) [6],CylHead *args_3)

{
  CylHead *in_R9;
  string local_30;
  
  make_string<char_const(&)[22],int&,char_const(&)[6],CylHead&>
            (&local_30,(util *)args,(char (*) [22])args_1,(int *)args_2,(char (*) [6])args_3,in_R9);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001dcc58;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}